

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeduh.c
# Opt level: O0

DUH_SIGNAL * make_signal(DUH_SIGTYPE_DESC *desc,sigdata_t *sigdata)

{
  sigdata_t *in_RSI;
  DUH_SIGTYPE_DESC *in_RDI;
  DUH_SIGNAL *signal;
  DUH_SIGNAL *local_8;
  
  local_8 = (DUH_SIGNAL *)malloc(0x10);
  if (local_8 == (DUH_SIGNAL *)0x0) {
    if ((in_RDI->unload_sigdata != (DUH_UNLOAD_SIGDATA)0x0) && (in_RSI != (sigdata_t *)0x0)) {
      (*in_RDI->unload_sigdata)(in_RSI);
    }
    local_8 = (DUH_SIGNAL *)0x0;
  }
  else {
    local_8->desc = in_RDI;
    local_8->sigdata = in_RSI;
  }
  return local_8;
}

Assistant:

static DUH_SIGNAL *make_signal(DUH_SIGTYPE_DESC *desc, sigdata_t *sigdata)
{
	DUH_SIGNAL *signal;

	ASSERT((desc->start_sigrenderer && desc->end_sigrenderer) || (!desc->start_sigrenderer && !desc->end_sigrenderer));
	ASSERT(desc->sigrenderer_generate_samples && desc->sigrenderer_get_current_sample);

	signal = malloc(sizeof(*signal));

	if (!signal) {
		if (desc->unload_sigdata)
			if (sigdata)
				(*desc->unload_sigdata)(sigdata);
		return NULL;
	}

	signal->desc = desc;
	signal->sigdata = sigdata;

	return signal;
}